

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionCheck.cpp
# Opt level: O2

void ExceptionCheck::SetHandledExceptionType(ExceptionType e)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ExceptionType *pEVar5;
  
  if (ExceptionType_DisableCheck < e) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                       ,0x38,
                       "((e & ExceptionType_DisableCheck) == 0 || e == ExceptionType_DisableCheck)",
                       "(e & ExceptionType_DisableCheck) == 0 || e == ExceptionType_DisableCheck");
    if (!bVar2) goto LAB_0060d6f1;
    *puVar4 = 0;
  }
  pEVar5 = (ExceptionType *)__tls_get_addr(&PTR_013e5e18);
  if (*pEVar5 != ExceptionType_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                       ,0x39,"(IsEmpty())","IsEmpty()");
    if (!bVar2) goto LAB_0060d6f1;
    *puVar4 = 0;
  }
  if ((e & ~ExceptionType_DisableCheck) != ExceptionType_None) {
    BVar3 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
    if ((BVar3 != 0) &&
       (e != ExceptionType_HasStackProbe &&
        (char)((e & ExceptionType_JavascriptException) >> 2) == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                         ,0x40,
                         "(e == ExceptionType_None || e == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || (e & ExceptionType_JavascriptException) == ExceptionType_JavascriptException || e == ExceptionType_HasStackProbe)"
                         ,
                         "e == ExceptionType_None || e == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || (e & ExceptionType_JavascriptException) == ExceptionType_JavascriptException || e == ExceptionType_HasStackProbe"
                        );
      if (!bVar2) {
LAB_0060d6f1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  *pEVar5 = e;
  return;
}

Assistant:

void ExceptionCheck::SetHandledExceptionType(ExceptionType e)
{
    Assert((e & ExceptionType_DisableCheck) == 0 || e == ExceptionType_DisableCheck);
    Assert(IsEmpty());

    // If script is active, we don't want any scope to try to handle OOM on its own, just let script handle it.
    Assert(e == ExceptionType_None ||
        e == ExceptionType_DisableCheck ||
        !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() ||
        (e & ExceptionType_JavascriptException) == ExceptionType_JavascriptException ||
        e == ExceptionType_HasStackProbe);

    data.handledExceptionType = e;
}